

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O0

uint16_t units::precise::custom::custom_count_unit_number(unit_data *UT)

{
  bool bVar1;
  bool bVar2;
  short sVar3;
  int iVar4;
  short sVar5;
  short sVar6;
  unit_data *in_RDI;
  uint num;
  
  bVar1 = units::detail::unit_data::has_e_flag(in_RDI);
  bVar2 = units::detail::unit_data::has_i_flag(in_RDI);
  sVar5 = 0;
  if (bVar2) {
    sVar5 = 2;
  }
  bVar2 = units::detail::unit_data::is_per_unit(in_RDI);
  sVar6 = 0;
  if (bVar2) {
    sVar6 = 4;
  }
  iVar4 = units::detail::unit_data::candela(in_RDI);
  sVar3 = 8;
  if (iVar4 == 0) {
    sVar3 = 0;
  }
  return sVar3 + (ushort)bVar1 + sVar5 + sVar6;
}

Assistant:

inline std::uint16_t
            custom_count_unit_number(const detail::unit_data& UT)
        {
            unsigned int num = (UT.has_e_flag() ? 1U : 0U) +
                (UT.has_i_flag() ? 2U : 0U) + (UT.is_per_unit() ? 4U : 0U);
            num += (UT.candela() == 0) ? 0U : 8U;
            return static_cast<std::uint16_t>(num);
        }